

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  Server<Client> server;
  LoggingHandler<Client> logging_handler;
  ExceptionHandler<Client> exception_handler;
  HTTPHandler<Client> http_handler;
  Acceptor<Client> acceptor;
  Config config;
  undefined4 in_stack_fffffffffffffe30;
  undefined4 uVar1;
  Config *in_stack_fffffffffffffe38;
  LoggingHandler<Client> *in_stack_fffffffffffffe40;
  path *in_stack_fffffffffffffe48;
  Server<Client> *in_stack_fffffffffffffe50;
  Server<Client> *in_stack_fffffffffffffe80;
  int in_stack_ffffffffffffff1c;
  Acceptor<Client> *in_stack_ffffffffffffff20;
  Config local_c;
  
  uVar1 = 0x1ed0;
  Server<Client>::Config::Config(&local_c,2,10,0x1ed0);
  Acceptor<Client>::Acceptor(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
  HTTPHandler<Client>::HTTPHandler
            ((HTTPHandler<Client> *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
             (ostream *)in_stack_fffffffffffffe40);
  ExceptionHandler<Client>::ExceptionHandler
            ((ExceptionHandler<Client> *)in_stack_fffffffffffffe40,
             (IHandler<Client> *)in_stack_fffffffffffffe38,
             (ostream *)CONCAT44(uVar1,in_stack_fffffffffffffe30));
  LoggingHandler<Client>::LoggingHandler
            (in_stack_fffffffffffffe40,(IHandler<Client> *)in_stack_fffffffffffffe38,
             (ostream *)CONCAT44(uVar1,in_stack_fffffffffffffe30));
  Server<Client>::Server
            (in_stack_fffffffffffffe50,(IHandler<Client> *)in_stack_fffffffffffffe48,
             (IAcceptor<Client> *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
             (ostream *)CONCAT44(uVar1,in_stack_fffffffffffffe30));
  Server<Client>::start(in_stack_fffffffffffffe80);
  Server<Client>::~Server((Server<Client> *)0x105a62);
  LoggingHandler<Client>::~LoggingHandler((LoggingHandler<Client> *)0x105a6f);
  ExceptionHandler<Client>::~ExceptionHandler((ExceptionHandler<Client> *)0x105a7c);
  HTTPHandler<Client>::~HTTPHandler
            ((HTTPHandler<Client> *)CONCAT44(uVar1,in_stack_fffffffffffffe30));
  Acceptor<Client>::~Acceptor((Acceptor<Client> *)0x105a96);
  return 0;
}

Assistant:

int main() {
    Server<Client>::Config config(
        THREADS_NUMBER, 
        QUEUE_SIZE,
        PORT
    );

    Acceptor<Client> acceptor(PORT);

    HTTPHandler<Client> http_handler(RESOLVE_PATH, std::cerr);
    ExceptionHandler<Client> exception_handler(http_handler, std::cerr);
    LoggingHandler<Client> logging_handler(exception_handler, std::cerr);

    Server<Client> server(logging_handler, acceptor, config, std::cerr);

    server.start();
}